

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_len(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  byte *pbVar3;
  
  if (getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_len();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_len::desc);
  if (iVar1 == 0) {
    if ((ulong)*(ushort *)str == 0) {
      vVar2 = 0;
    }
    else {
      pbVar3 = (byte *)(str + 2);
      vVar2 = 0;
      do {
        pbVar3 = pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 & (uint)(*pbVar3 >> 7) * 3) + 1;
        vVar2 = vVar2 + 1;
      } while (pbVar3 < str + (ulong)*(ushort *)str + 2);
    }
    retval->typ = VM_INT;
    (retval->val).obj = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_len(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                           const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up a utf-8 pointer to the string's contents */
    utf8_ptr p;
    p.set((char *)str + VMB_LEN);

    /* return the character length of the string */
    retval->set_int(p.len(vmb_get_len(str)));

    /* handled */
    return TRUE;
}